

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_string.c
# Opt level: O2

HPDF_STATUS HPDF_String_Write(HPDF_String obj,HPDF_Stream_conflict stream,HPDF_Encrypt e)

{
  byte bVar1;
  HPDF_BYTE *pHVar2;
  HPDF_Stream_conflict stream_00;
  HPDF_UINT len;
  HPDF_ByteType HVar3;
  HPDF_STATUS HVar4;
  uint uVar5;
  ulong uVar6;
  HPDF_BYTE *data;
  HPDF_UNICODE local_272;
  HPDF_Encoder_conflict *local_270;
  HPDF_Encrypt local_268;
  HPDF_Stream_conflict local_260;
  ulong local_258;
  HPDF_ParseText_Rec parse_state;
  HPDF_BYTE buf [512];
  
  if (e == (HPDF_Encrypt)0x0) {
    if (obj->encoder == (HPDF_Encoder_conflict)0x0) {
      HVar4 = HPDF_Stream_WriteEscapeText(stream,(char *)obj->value);
      return HVar4;
    }
  }
  else {
    HPDF_Encrypt_Reset(e);
    if (obj->encoder == (HPDF_Encoder_conflict)0x0) {
      HVar4 = HPDF_Stream_WriteChar(stream,'<');
      if (HVar4 != 0) {
        return HVar4;
      }
      pHVar2 = obj->value;
      len = HPDF_StrLen((char *)pHVar2,-1);
      HVar4 = HPDF_Stream_WriteBinary(stream,pHVar2,len,e);
      if (HVar4 != 0) {
        return HVar4;
      }
      HVar4 = HPDF_Stream_WriteChar(stream,'>');
      return HVar4;
    }
  }
  local_270 = &obj->encoder;
  pHVar2 = obj->value;
  uVar5 = obj->len;
  HVar4 = HPDF_Stream_WriteChar(stream,'<');
  if ((HVar4 == 0) && (HVar4 = HPDF_Stream_WriteBinary(stream,UNICODE_HEADER,2,e), HVar4 == 0)) {
    local_268 = e;
    local_260 = stream;
    HPDF_Encoder_SetParseText(*local_270,&parse_state,pHVar2,uVar5);
    uVar6 = 0;
    local_258 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      local_258 = uVar6;
    }
    data = buf;
    uVar5 = 0;
    for (; stream_00 = local_260, local_258 != uVar6; uVar6 = uVar6 + 1) {
      bVar1 = pHVar2[uVar6];
      HVar3 = HPDF_Encoder_ByteType(*local_270,&parse_state);
      if (0xfe < uVar5) {
        data = buf;
        HVar4 = HPDF_Stream_WriteBinary(local_260,data,uVar5 * 2,local_268);
        uVar5 = 0;
        if (HVar4 != 0) {
          return HVar4;
        }
      }
      if (HVar3 != HPDF_BYTE_TYPE_TRAIL) {
        if (HVar3 == HPDF_BYTE_TYPE_LEAD) {
          local_272 = HPDF_Encoder_ToUnicode(*local_270,CONCAT11(bVar1,pHVar2[uVar6 + 1]));
        }
        else {
          local_272 = HPDF_Encoder_ToUnicode(*local_270,(ushort)bVar1);
        }
        HPDF_UInt16Swap(&local_272);
        HPDF_MemCpy(data,(HPDF_BYTE *)&local_272,2);
        data = data + 2;
        uVar5 = uVar5 + 1;
      }
    }
    if ((uVar5 == 0) ||
       (HVar4 = HPDF_Stream_WriteBinary(local_260,buf,uVar5 * 2,local_268), HVar4 == 0)) {
      HVar4 = HPDF_Stream_WriteChar(stream_00,'>');
    }
  }
  return HVar4;
}

Assistant:

HPDF_STATUS
HPDF_String_Write  (HPDF_String   obj,
                    HPDF_Stream   stream,
                    HPDF_Encrypt  e)
{
    HPDF_STATUS ret;

    /*
     *  When encoder is not NULL, text is changed to unicode using encoder,
     *  and it outputs by HPDF_write_binary method.
     */

    HPDF_PTRACE((" HPDF_String_Write\n"));

    if (e)
        HPDF_Encrypt_Reset (e);

    if (obj->encoder == NULL) {
        if (e) {
            if ((ret = HPDF_Stream_WriteChar (stream, '<')) != HPDF_OK)
                return ret;

            if ((ret = HPDF_Stream_WriteBinary (stream, obj->value,
                    HPDF_StrLen ((char *)obj->value, -1), e)) != HPDF_OK)
                return ret;

            return HPDF_Stream_WriteChar (stream, '>');
        } else {
            return HPDF_Stream_WriteEscapeText (stream, (char *)obj->value);
        }
    } else {
        HPDF_BYTE* src = obj->value;
        HPDF_BYTE buf[HPDF_TEXT_DEFAULT_LEN * 2];
        HPDF_UINT tmp_len = 0;
        HPDF_BYTE* pbuf = buf;
        HPDF_INT32 len = obj->len;
        HPDF_ParseText_Rec  parse_state;
        HPDF_UINT i;

        if ((ret = HPDF_Stream_WriteChar (stream, '<')) != HPDF_OK)
           return ret;

        if ((ret = HPDF_Stream_WriteBinary (stream, UNICODE_HEADER, 2, e))
                        != HPDF_OK)
            return ret;

        HPDF_Encoder_SetParseText (obj->encoder, &parse_state, src, len);

        for (i = 0; (HPDF_INT32)i < len; i++) {
            HPDF_BYTE b = src[i];
            HPDF_UNICODE tmp_unicode;
            HPDF_ByteType btype = HPDF_Encoder_ByteType (obj->encoder,
                    &parse_state);

            if (tmp_len >= HPDF_TEXT_DEFAULT_LEN - 1) {
                if ((ret = HPDF_Stream_WriteBinary (stream, buf,
                            tmp_len * 2, e)) != HPDF_OK)
                    return ret;

                tmp_len = 0;
                pbuf = buf;
            }

            if (btype != HPDF_BYTE_TYPE_TRAIL) {
                if (btype == HPDF_BYTE_TYPE_LEAD) {
                    HPDF_BYTE b2 = src[i + 1];
                    HPDF_UINT16 char_code = (HPDF_UINT16)((HPDF_UINT) b * 256 + b2);

                    tmp_unicode = HPDF_Encoder_ToUnicode (obj->encoder,
                                char_code);
                } else {
                    tmp_unicode = HPDF_Encoder_ToUnicode (obj->encoder, b);
                }

                HPDF_UInt16Swap (&tmp_unicode);
                HPDF_MemCpy (pbuf, (HPDF_BYTE*)&tmp_unicode, 2);
                pbuf += 2;
                tmp_len++;
            }
        }

        if (tmp_len > 0) {
            if ((ret = HPDF_Stream_WriteBinary (stream, buf, tmp_len * 2, e))
                            != HPDF_OK)
                return ret;
        }

        if ((ret = HPDF_Stream_WriteChar (stream, '>')) != HPDF_OK)
            return ret;
    }

    return HPDF_OK;
}